

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O3

ThreadCache * __thiscall
tcmalloc::PageHeapAllocator<tcmalloc::ThreadCache>::New
          (PageHeapAllocator<tcmalloc::ThreadCache> *this)

{
  LogItem b;
  LogItem c;
  LogItem d;
  char *pcVar1;
  ThreadCache *pTVar2;
  ulong uVar3;
  undefined4 uStack_44;
  anon_union_8_4_e5b1a622_for_u_ aStack_40;
  undefined4 uStack_34;
  undefined4 uStack_24;
  
  pTVar2 = (ThreadCache *)this->free_list_;
  if (pTVar2 == (ThreadCache *)0x0) {
    uVar3 = this->free_avail_;
    if (uVar3 < 0x1040) {
      uVar3 = 0x20000;
      pcVar1 = (char *)MetaDataAlloc(0x20000);
      this->free_area_ = pcVar1;
      if (pcVar1 == (char *)0x0) {
        d._4_4_ = uStack_44;
        d.tag_ = 4;
        c._4_4_ = uStack_24;
        c.tag_ = 2;
        b._4_4_ = uStack_34;
        b.tag_ = 1;
        b.u_.snum = 0x20000;
        c.u_.str = (char *)0x1040;
        d.u_.str = aStack_40.str;
        Log(kCrash,
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap_allocator.h"
            ,0x4c,(LogItem)(ZEXT816(0x11cbe8) << 0x40),b,c,d);
      }
    }
    pTVar2 = (ThreadCache *)this->free_area_;
    this->free_area_ = (char *)(pTVar2 + 1);
    this->free_avail_ = uVar3 - 0x1040;
  }
  else {
    this->free_list_ = pTVar2->list_[0].list_;
  }
  this->inuse_ = this->inuse_ + 1;
  return pTVar2;
}

Assistant:

T* New() {
    // Consult free list
    void* result;
    if (free_list_ != nullptr) {
      result = free_list_;
      free_list_ = *(reinterpret_cast<void**>(result));
    } else {
      if (free_avail_ < sizeof(T)) {
        // Need more room. We assume that MetaDataAlloc returns
        // suitably aligned memory.
        free_area_ = reinterpret_cast<char*>(MetaDataAlloc(kAllocIncrement));
        if (free_area_ == nullptr) {
          Log(kCrash, __FILE__, __LINE__,
              "FATAL ERROR: Out of memory trying to allocate internal "
              "tcmalloc data (bytes, object-size)",
              kAllocIncrement, sizeof(T));
        }
        free_avail_ = kAllocIncrement;
      }
      result = free_area_;
      free_area_ += sizeof(T);
      free_avail_ -= sizeof(T);
    }
    inuse_++;
    return reinterpret_cast<T*>(result);
  }